

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)0>::decode0
          (Predecoder<(InstructionSet::M68k::Model)0> *this,uint16_t instruction)

{
  ushort uVar1;
  Preinstruction PVar2;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)0> *this_local;
  
  uVar1 = instruction & 0xfff;
  if (uVar1 == 0x3c) {
    this_local._4_4_ = decode<(unsigned_char)34,true>(this,instruction);
  }
  else if (uVar1 == 0x7c) {
    this_local._4_4_ = decode<(unsigned_char)33,true>(this,instruction);
  }
  else if (uVar1 == 0x23c) {
    this_local._4_4_ = decode<(unsigned_char)36,true>(this,instruction);
  }
  else if (uVar1 == 0x27c) {
    this_local._4_4_ = decode<(unsigned_char)35,true>(this,instruction);
  }
  else if (uVar1 == 0xa3c) {
    this_local._4_4_ = decode<(unsigned_char)38,true>(this,instruction);
  }
  else if (uVar1 == 0xa7c) {
    this_local._4_4_ = decode<(unsigned_char)37,true>(this,instruction);
  }
  else {
    uVar1 = instruction & 0xfc0;
    if ((instruction & 0xfc0) == 0) {
      this_local._4_4_ = decode<(unsigned_char)155,true>(this,instruction);
    }
    else if (uVar1 == 0x40) {
      this_local._4_4_ = decode<(unsigned_char)156,true>(this,instruction);
    }
    else if (uVar1 == 0x80) {
      this_local._4_4_ = decode<(unsigned_char)157,true>(this,instruction);
    }
    else {
      if (uVar1 != 0xc0) {
        if (uVar1 == 0x200) {
          PVar2 = decode<(unsigned_char)161,true>(this,instruction);
          return PVar2;
        }
        if (uVar1 == 0x240) {
          PVar2 = decode<(unsigned_char)162,true>(this,instruction);
          return PVar2;
        }
        if (uVar1 == 0x280) {
          PVar2 = decode<(unsigned_char)163,true>(this,instruction);
          return PVar2;
        }
        if (uVar1 != 0x2c0) {
          if (uVar1 == 0x400) {
            PVar2 = decode<(unsigned_char)158,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 == 0x440) {
            PVar2 = decode<(unsigned_char)159,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 == 0x480) {
            PVar2 = decode<(unsigned_char)160,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 != 0x4c0) {
            if (uVar1 == 0x600) {
              PVar2 = decode<(unsigned_char)152,true>(this,instruction);
              return PVar2;
            }
            if (uVar1 == 0x640) {
              PVar2 = decode<(unsigned_char)153,true>(this,instruction);
              return PVar2;
            }
            if (uVar1 == 0x680) {
              PVar2 = decode<(unsigned_char)154,true>(this,instruction);
              return PVar2;
            }
            if (uVar1 != 0x6c0) {
              if (uVar1 == 0x800) {
                PVar2 = decode<(unsigned_char)170,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 == 0x840) {
                PVar2 = decode<(unsigned_char)171,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 == 0x880) {
                PVar2 = decode<(unsigned_char)172,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 == 0x8c0) {
                PVar2 = decode<(unsigned_char)173,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 == 0xa00) {
                PVar2 = decode<(unsigned_char)164,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 == 0xa40) {
                PVar2 = decode<(unsigned_char)165,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 == 0xa80) {
                PVar2 = decode<(unsigned_char)166,true>(this,instruction);
                return PVar2;
              }
              if (uVar1 != 0xac0) {
                if (uVar1 == 0xc00) {
                  PVar2 = decode<(unsigned_char)167,true>(this,instruction);
                  return PVar2;
                }
                if (uVar1 == 0xc40) {
                  PVar2 = decode<(unsigned_char)168,true>(this,instruction);
                  return PVar2;
                }
                if (uVar1 == 0xc80) {
                  PVar2 = decode<(unsigned_char)169,true>(this,instruction);
                  return PVar2;
                }
              }
            }
          }
        }
      }
      uVar1 = instruction & 0x1f8;
      if (uVar1 == 0x108) {
        this_local._4_4_ = decode<(unsigned_char)138,true>(this,instruction);
      }
      else if (uVar1 == 0x148) {
        this_local._4_4_ = decode<(unsigned_char)137,true>(this,instruction);
      }
      else if (uVar1 == 0x188) {
        this_local._4_4_ = decode<(unsigned_char)140,true>(this,instruction);
      }
      else if (uVar1 == 0x1c8) {
        this_local._4_4_ = decode<(unsigned_char)139,true>(this,instruction);
      }
      else {
        uVar1 = instruction & 0x1c0;
        if (uVar1 == 0x100) {
          this_local._4_4_ = decode<(unsigned_char)39,true>(this,instruction);
        }
        else if (uVar1 == 0x140) {
          this_local._4_4_ = decode<(unsigned_char)41,true>(this,instruction);
        }
        else if (uVar1 == 0x180) {
          this_local._4_4_ = decode<(unsigned_char)40,true>(this,instruction);
        }
        else if (uVar1 == 0x1c0) {
          this_local._4_4_ = decode<(unsigned_char)42,true>(this,instruction);
        }
        else {
          memset((void *)((long)&this_local + 4),0,4);
          Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decode0(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0xfff) {
		case 0x03c:	Decode(Op::ORItoCCR);	// 4-155 (p259)
		case 0x07c:	Decode(Op::ORItoSR);	// 6-27 (p481)
		case 0x23c:	Decode(Op::ANDItoCCR);	// 4-20 (p124)
		case 0x27c:	Decode(Op::ANDItoSR);	// 6-2 (p456)
		case 0xa3c:	Decode(Op::EORItoCCR);	// 4-104 (p208)
		case 0xa7c:	Decode(Op::EORItoSR);	// 6-10 (p464)

		// 4-68 (p172)
		case 0xcfc:	DecodeReq(model >= Model::M68020, Op::CAS2w);
		case 0xefc:	DecodeReq(model >= Model::M68020, Op::CAS2l);

		default:	break;
	}

	switch(instruction & 0xff0) {
		case 0x6c0:	DecodeReq(model == Model::M68020, Op::RTM);	// 4-167 (p271)

		default:	break;
	}

	switch(instruction & 0xfc0) {
		// 4-153 (p257)
		case 0x000:	Decode(ORIb);
		case 0x040:	Decode(ORIw);
		case 0x080:	Decode(ORIl);

		// 4-18 (p122)
		case 0x200:	Decode(ANDIb);
		case 0x240:	Decode(ANDIw);
		case 0x280:	Decode(ANDIl);

		// 4-179 (p283)
		case 0x400:	Decode(SUBIb);
		case 0x440:	Decode(SUBIw);
		case 0x480:	Decode(SUBIl);

		// 4-9 (p113)
		case 0x600:	Decode(ADDIb);
		case 0x640:	Decode(ADDIw);
		case 0x680:	Decode(ADDIl);

		// 4-63 (p167)
		case 0x800:	Decode(BTSTI);

		// 4-29 (p133)
		case 0x840:	Decode(BCHGI);

		// 4-32 (p136)
		case 0x880:	Decode(BCLRI);

		// 4-58 (p162)
		case 0x8c0:	Decode(BSETI);

		// 4-102 (p206)
		case 0xa00:	Decode(EORIb);
		case 0xa40:	Decode(EORIw);
		case 0xa80:	Decode(EORIl);

		// 4-79 (p183)
		case 0xc00:	Decode(CMPIb);
		case 0xc40:	Decode(CMPIw);
		case 0xc80:	Decode(CMPIl);

		// 4-64 (p168)
		case 0x6c0: DecodeReq(model == Model::M68020, Op::CALLM);

		// 4-67 (p171)
		case 0xac0:	DecodeReq(model >= Model::M68020, Op::CASb);
		case 0xcc0:	DecodeReq(model >= Model::M68020, Op::CASw);
		case 0xec0:	DecodeReq(model >= Model::M68020, Op::CASl);

		// 4-83 (p187) [CMP2] and 4-72 (p176) [CHK2];
		// the two are distinguished by a bit in the extension word.
		case 0x0c0:	DecodeReq(model >= Model::M68020, Op::CHKorCMP2b);
		case 0x2c0:	DecodeReq(model >= Model::M68020, Op::CHKorCMP2b);
		case 0x4c0:	DecodeReq(model >= Model::M68020, Op::CHKorCMP2b);

		// 6-24 (p478)
		case 0xe00: DecodeReq(model >= Model::M68010, Op::MOVESb);
		case 0xe40: DecodeReq(model >= Model::M68010, Op::MOVESw);
		case 0xe80: DecodeReq(model >= Model::M68010, Op::MOVESl);

		default:	break;
	}

	switch(instruction & 0x1f8) {
		// 4-133 (p237)
		case 0x108:	Decode(MOVEPtoRw);
		case 0x148:	Decode(MOVEPtoRl);
		case 0x188:	Decode(MOVEPtoMw);
		case 0x1c8:	Decode(MOVEPtoMl);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		case 0x100:	Decode(Op::BTST);	// 4-62 (p166)
		case 0x180:	Decode(Op::BCLR);	// 4-31 (p135)

		case 0x140:	Decode(Op::BCHG);	// 4-28 (p132)
		case 0x1c0:	Decode(Op::BSET);	// 4-57 (p161)

		default:	break;
	}

	return Preinstruction();
}